

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
handle_str_callback_url_decoded
          (_func_int_void_ptr_char_ptr_size_t *callback,char *str,size_t strLen,
          curi_settings *settings,void *userData)

{
  int iVar1;
  char *output;
  char *urlDecodedStr;
  size_t urlDecodedStrLen;
  size_t allocationSize;
  void *pvStack_30;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t strLen_local;
  char *str_local;
  _func_int_void_ptr_char_ptr_size_t *callback_local;
  
  allocationSize._4_4_ = curi_status_success;
  if ((strLen != 0) && (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0)) {
    urlDecodedStrLen = strLen + 1;
    pvStack_30 = userData;
    userData_local = settings;
    settings_local = (curi_settings *)strLen;
    strLen_local = (size_t)str;
    str_local = (char *)callback;
    output = (char *)(*settings->allocate)(userData,urlDecodedStrLen);
    allocationSize._4_4_ =
         curi_url_decode((char *)strLen_local,(size_t)settings_local,output,
                         (size_t)((long)&settings_local->allocate + 1),(size_t *)&urlDecodedStr);
    if ((allocationSize._4_4_ == curi_status_success) &&
       (iVar1 = (*(code *)str_local)(pvStack_30,output,urlDecodedStr), iVar1 == 0)) {
      allocationSize._4_4_ = curi_status_canceled;
    }
    (**(code **)((long)userData_local + 8))(pvStack_30,output,urlDecodedStrLen);
  }
  return allocationSize._4_4_;
}

Assistant:

static curi_status handle_str_callback_url_decoded(int (*callback)(void* userData, const char* str, size_t strLen), const char* str, size_t strLen, const curi_settings* settings, void* userData)
{
    curi_status status = curi_status_success;

    if (strLen > 0 && callback)
    {
        size_t allocationSize = (strLen+1) * sizeof(char);
        size_t urlDecodedStrLen;
        char* urlDecodedStr = (char*)settings->allocate(userData, allocationSize);

        status = curi_url_decode(str,strLen,urlDecodedStr,strLen+1,&urlDecodedStrLen);

        if (status == curi_status_success)
            if (callback(userData,urlDecodedStr,urlDecodedStrLen) == 0)
                status =  curi_status_canceled;

        settings->deallocate(userData, urlDecodedStr, allocationSize);
    }

    return status;
}